

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O0

void assert_watch_file_current_dir(uv_loop_t *loop,int file_or_dir)

{
  int iVar1;
  char *path;
  undefined1 local_138 [4];
  int r;
  uv_fs_event_t fs_event;
  uv_timer_t timer;
  int file_or_dir_local;
  uv_loop_t *loop_local;
  
  remove("watch_file");
  create_file("watch_file");
  iVar1 = uv_fs_event_init(loop,(uv_fs_event_t *)local_138);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x1a8,"r == 0");
    abort();
  }
  path = "watch_file";
  if (file_or_dir == 1) {
    path = ".";
  }
  iVar1 = uv_fs_event_start((uv_fs_event_t *)local_138,fs_event_cb_file_current_dir,path,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x1af,"r == 0");
    abort();
  }
  iVar1 = uv_timer_init(loop,(uv_timer_t *)&fs_event.wd);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x1b2,"r == 0");
    abort();
  }
  iVar1 = uv_timer_start((uv_timer_t *)&fs_event.wd,timer_cb_touch,100,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x1b5,"r == 0");
    abort();
  }
  if (timer_cb_touch_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x1b7,"timer_cb_touch_called == 0");
    abort();
  }
  if (fs_event_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x1b8,"fs_event_cb_called == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (timer_cb_touch_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x1bc,"timer_cb_touch_called == 1");
    abort();
  }
  if (fs_event_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x1bd,"fs_event_cb_called == 1");
    abort();
  }
  remove("watch_file");
  fs_event_cb_called = 0;
  timer_cb_touch_called = 0;
  uv_run(loop,UV_RUN_DEFAULT);
  return;
}

Assistant:

static void assert_watch_file_current_dir(uv_loop_t* const loop, int file_or_dir) {
  uv_timer_t timer;
  uv_fs_event_t fs_event;
  int r;

  /* Setup */
  remove("watch_file");
  create_file("watch_file");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  /* watching a dir is the only way to get fsevents involved on apple
     platforms */
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file_current_dir,
                        file_or_dir == 1 ? "." : "watch_file",
                        0);
  ASSERT(r == 0);

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb_touch, 100, 0);
  ASSERT(r == 0);

  ASSERT(timer_cb_touch_called == 0);
  ASSERT(fs_event_cb_called == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(timer_cb_touch_called == 1);
  ASSERT(fs_event_cb_called == 1);

  /* Cleanup */
  remove("watch_file");
  fs_event_cb_called = 0;
  timer_cb_touch_called = 0;
  uv_run(loop, UV_RUN_DEFAULT); /* flush pending closes */
}